

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefitool.cpp
# Opt level: O0

void __thiscall UEFITool::dropEvent(UEFITool *this,QDropEvent *event)

{
  QString local_70;
  QList<QUrl> local_48;
  undefined1 local_30 [8];
  QString path;
  QDropEvent *event_local;
  UEFITool *this_local;
  
  path.d.size = (qsizetype)event;
  QDropEvent::mimeData(event);
  QMimeData::urls();
  QList<QUrl>::at(&local_48,0);
  QUrl::toLocalFile();
  QList<QUrl>::~QList(&local_48);
  QString::QString(&local_70,(QString *)local_30);
  openImageFile(this,&local_70);
  QString::~QString(&local_70);
  QString::~QString((QString *)local_30);
  return;
}

Assistant:

void UEFITool::dropEvent(QDropEvent* event)
{
    QString path = event->mimeData()->urls().at(0).toLocalFile();
    openImageFile(path);
}